

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O0

void dump_regs(int cnum,FILE *outf,uint32_t *ref_val,int ref_exist,uint32_t reg,uint32_t regs_len,
              color color)

{
  uint32_t uVar1;
  int in_ECX;
  long in_RDX;
  FILE *in_RSI;
  uint32_t in_EDI;
  int in_R8D;
  uint in_R9D;
  FILE *unaff_retaddr;
  int r;
  uint32_t val;
  uint local_2c;
  uint32_t in_stack_fffffffffffffff8;
  
  for (local_2c = 0; local_2c < in_R9D; local_2c = local_2c + 4) {
    if ((int)local_2c % 0x10 == 0) {
      fprintf(in_RSI,"%08x: ",(ulong)(in_R8D + local_2c));
    }
    uVar1 = nva_rd32(in_EDI,in_R8D + local_2c);
    print_reg_diff(unaff_retaddr,in_EDI,in_stack_fffffffffffffff8,(color)((ulong)in_RSI >> 0x20));
    if (in_ECX == 0) {
      *(uint32_t *)(in_RDX + (long)(int)local_2c * 4) = uVar1;
    }
    if ((int)local_2c % 0x10 == 0xc) {
      fprintf(in_RSI,"\n");
    }
  }
  return;
}

Assistant:

static void
dump_regs(int cnum, FILE* outf, uint32_t ref_val[], int ref_exist, uint32_t reg, uint32_t regs_len, enum color color)
{
	uint32_t val;
	int r;

	for (r = 0; r < regs_len; r+=4)
        {
                if (r % 0x10 == 0)
                        fprintf(outf, "%08x: ", reg + r);

                val = nva_rd32(cnum, reg + r);

                print_reg_diff(outf, ref_val[r], val, color);

                /* if the value wasn't initialized before, store it as a reference */
                if (ref_exist == 0)
                        ref_val[r] = val;

                if (r % 0x10 == 0xc)
                        fprintf(outf, "\n");
        }
}